

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.cpp
# Opt level: O2

void UpdateUVIndex(list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *l,uint n)

{
  _List_node_base *p_Var1;
  uint n_local;
  
  p_Var1 = (_List_node_base *)l;
  n_local = n;
  while (p_Var1 = (((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)l) {
    if (p_Var1[1]._M_next == (_List_node_base *)0x0) {
      if (n_local == 0) {
        aiMaterial::AddProperty<int>
                  ((aiMaterial *)p_Var1[1]._M_prev,(int *)&n_local,1,"$tex.uvwsrc",
                   *(uint *)&p_Var1[2]._M_next,*(uint *)((long)&p_Var1[2]._M_next + 4));
      }
    }
    else {
      *(uint *)p_Var1[1]._M_next = n_local;
    }
  }
  return;
}

Assistant:

void UpdateUVIndex(const std::list<TTUpdateInfo>& l, unsigned int n)
{
    // Don't set if == 0 && wasn't set before
    for (std::list<TTUpdateInfo>::const_iterator it = l.begin();it != l.end(); ++it) {
        const TTUpdateInfo& info = *it;

        if (info.directShortcut)
            *info.directShortcut = n;
        else if (!n)
        {
            info.mat->AddProperty<int>((int*)&n,1,AI_MATKEY_UVWSRC(info.semantic,info.index));
        }
    }
}